

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonSplitFormatter.cpp
# Opt level: O1

ostream * __thiscall
cali::JsonSplitFormatter::JsonSplitFormatterImpl::write_column_metadata
          (JsonSplitFormatterImpl *this,ostream *os,Column *column,
          CaliperMetadataAccessInterface *db)

{
  char cVar1;
  pointer pAVar2;
  Node *pNVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar8;
  cali_id_t cVar9;
  char cVar10;
  size_type sVar11;
  Attribute attr;
  string local_70;
  Attribute local_50;
  CaliperMetadataAccessInterface *local_48;
  Variant local_40;
  long *plVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"is_value\": ",0xc);
  pcVar8 = "true";
  if ((ulong)column->is_hierarchy != 0) {
    pcVar8 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,(ulong)column->is_hierarchy | 4);
  pAVar2 = (column->attributes).
           super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(column->attributes).
            super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pAVar2 == 8) {
    pNVar3 = pAVar2->m_node;
    if (pNVar3 == (Node *)0x0) {
      cVar9 = 0xffffffffffffffff;
    }
    else {
      cVar9 = pNVar3->m_id;
    }
    iVar6 = (**db->_vptr_CaliperMetadataAccessInterface)(db,cVar9);
    plVar7 = (long *)CONCAT44(extraout_var,iVar6);
    local_48 = db;
    if (plVar7 == (long *)0x0) {
      plVar7 = (long *)0x0;
    }
    else {
      plVar7 = *(long **)(*plVar7 + plVar7[1]);
    }
    for (; (plVar7 != (long *)0x0 && (plVar7[2] != -1)); plVar7 = *(long **)(*plVar7 + plVar7[1])) {
      iVar6 = (*db->_vptr_CaliperMetadataAccessInterface[1])(db,plVar7[6]);
      local_50.m_node = (Node *)CONCAT44(extraout_var_00,iVar6);
      if (((local_50.m_node == (Node *)0x0) || (0xb < (local_50.m_node)->m_id)) &&
         (iVar6 = Attribute::properties(&local_50), -1 < (char)iVar6)) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", \"",3);
        pcVar8 = Attribute::name_c_str(&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,pcVar8,(allocator<char> *)&local_40);
        sVar5 = local_70._M_string_length;
        _Var4._M_p = local_70._M_dataplus._M_p;
        cVar10 = (char)os;
        if (local_70._M_string_length != 0) {
          sVar11 = 0;
          do {
            cVar1 = _Var4._M_p[sVar11];
            if (cVar1 == '\n') {
              std::ostream::put(cVar10);
              std::ostream::put(cVar10);
            }
            if ('\x1f' < cVar1) {
              if ((cVar1 == '\\') || (cVar1 == '\"')) {
                std::ostream::put(cVar10);
              }
              std::ostream::put(cVar10);
            }
            sVar11 = sVar11 + 1;
          } while (sVar5 != sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\": ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        local_40.m_v.type_and_size = plVar7[7];
        local_40.m_v.value = *(anon_union_8_7_33918203_for_value *)(plVar7 + 8);
        Variant::to_string_abi_cxx11_(&local_70,&local_40);
        sVar5 = local_70._M_string_length;
        _Var4._M_p = local_70._M_dataplus._M_p;
        if (local_70._M_string_length != 0) {
          sVar11 = 0;
          do {
            cVar1 = _Var4._M_p[sVar11];
            if (cVar1 == '\n') {
              std::ostream::put(cVar10);
              std::ostream::put(cVar10);
            }
            if ('\x1f' < cVar1) {
              if ((cVar1 == '\\') || (cVar1 == '\"')) {
                std::ostream::put(cVar10);
              }
              std::ostream::put(cVar10);
            }
            sVar11 = sVar11 + 1;
          } while (sVar5 != sVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        db = local_48;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return os;
}

Assistant:

std::ostream& write_column_metadata(std::ostream& os, const Column& column, CaliperMetadataAccessInterface& db)
    {
        os << "\"is_value\": " << (column.is_hierarchy ? "false" : "true");

        // for single-attribute columns (i.e. not "path"), write metadata
        if (column.attributes.size() == 1) {
            const Node* node = db.node(column.attributes.front().id());

            if (node)
                node = node->parent();

            for (; node && node->id() != CALI_INV_ID; node = node->parent()) {
                Attribute attr = db.get_attribute(node->attribute());

                // skip bootstrap info and hidden attributes
                if (attr.id() < 12 || attr.is_hidden())
                    continue;

                util::write_json_esc_string(os << ", \"", attr.name_c_str()) << "\": ";
                util::write_json_esc_string(os << "\"", node->data().to_string()) << "\"";
            }
        }

        return os;
    }